

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int moveto_snode_parent(lyxp_set *set,lys_node *cur_node,int all_desc,int options)

{
  int iVar1;
  char *pcVar2;
  lys_module *module;
  LY_ERR *pLVar3;
  bool bVar4;
  lyxp_node_type local_58;
  lyxp_node_type local_54;
  lyxp_node_type new_type;
  lyxp_node_type root_type;
  lys_node *root;
  lys_node *new_node;
  lys_node *node;
  int temp_ctx;
  int orig_used;
  int i;
  int idx;
  int options_local;
  int all_desc_local;
  lys_node *cur_node_local;
  lyxp_set *set_local;
  
  node._0_4_ = 0;
  if ((set == (lyxp_set *)0x0) || (set->type == LYXP_SET_EMPTY)) {
    set_local._4_4_ = 0;
  }
  else {
    i = options;
    idx = all_desc;
    _options_local = cur_node;
    cur_node_local = (lys_node *)set;
    if (set->type == LYXP_SET_SNODE_SET) {
      if (all_desc != 0) {
        iVar1 = moveto_snode_self(set,cur_node,1,options);
        if (iVar1 != 0) {
          return iVar1;
        }
        orig_used = 0;
      }
      _new_type = moveto_snode_get_root(_options_local,i,&local_54);
      node._4_4_ = *(int *)&cur_node_local->ext;
      for (temp_ctx = 0; temp_ctx < node._4_4_; temp_ctx = temp_ctx + 1) {
        if (*(int *)(cur_node_local->ref + (long)temp_ctx * 0x10 + 0xc) == 1) {
          pcVar2 = cur_node_local->ref + (long)temp_ctx * 0x10 + 0xc;
          pcVar2[0] = '\0';
          pcVar2[1] = '\0';
          pcVar2[2] = '\0';
          pcVar2[3] = '\0';
          new_node = *(lys_node **)(cur_node_local->ref + (long)temp_ctx * 0x10);
          if (*(int *)(cur_node_local->ref + (long)temp_ctx * 0x10 + 8) == 2) {
            root = lys_parent(new_node);
            while( true ) {
              bVar4 = false;
              if (root != (lys_node *)0x0) {
                bVar4 = (root->nodetype & (LYS_USES|LYS_OUTPUT|LYS_INPUT|LYS_CASE|LYS_CHOICE)) !=
                        LYS_UNKNOWN;
              }
              if (!bVar4) break;
              root = lys_parent(root);
            }
            if (_new_type == new_node) {
              if (((i & 0x18U) == 0) || ((_options_local->flags & 1) == 0)) {
                local_58 = LYXP_NODE_ROOT;
              }
              else {
                local_58 = LYXP_NODE_ROOT_CONFIG;
              }
              root = new_node;
            }
            else if (root == (lys_node *)0x0) {
              if (((i & 0x18U) == 0) || ((_options_local->flags & 1) == 0)) {
                local_58 = LYXP_NODE_ROOT;
              }
              else {
                local_58 = LYXP_NODE_ROOT_CONFIG;
              }
              module = lys_node_module(new_node);
              new_node = lys_getnext((lys_node *)0x0,(lys_node *)0x0,module,0);
              if (new_node != _new_type) {
                pLVar3 = ly_errno_location();
                *pLVar3 = LY_EINT;
                ly_log(LY_LLERR,"Internal error (%s:%d).",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                       ,0x153c);
              }
              root = _new_type;
            }
            else {
              local_58 = LYXP_NODE_ELEM;
            }
            if ((local_58 != LYXP_NODE_ELEM) && ((local_58 != local_54 || (root != _new_type)))) {
              __assert_fail("(new_type == LYXP_NODE_ELEM) || ((new_type == root_type) && (new_node == root))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                            ,0x1546,
                            "int moveto_snode_parent(struct lyxp_set *, struct lys_node *, int, int)"
                           );
            }
            orig_used = set_snode_insert_node((lyxp_set *)cur_node_local,root,local_58);
            if ((orig_used < node._4_4_) && (temp_ctx < orig_used)) {
              pcVar2 = cur_node_local->ref + (long)orig_used * 0x10 + 0xc;
              pcVar2[0] = '\x02';
              pcVar2[1] = '\0';
              pcVar2[2] = '\0';
              pcVar2[3] = '\0';
              node._0_4_ = 1;
            }
          }
        }
      }
      if ((int)node != 0) {
        for (temp_ctx = 0; temp_ctx < node._4_4_; temp_ctx = temp_ctx + 1) {
          if (*(int *)(cur_node_local->ref + (long)temp_ctx * 0x10 + 0xc) == 2) {
            pcVar2 = cur_node_local->ref + (long)temp_ctx * 0x10 + 0xc;
            pcVar2[0] = '\x01';
            pcVar2[1] = '\0';
            pcVar2[2] = '\0';
            pcVar2[3] = '\0';
          }
        }
      }
      set_local._4_4_ = 0;
    }
    else {
      pcVar2 = print_set_type(set);
      ly_vlog(LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar2);
      set_local._4_4_ = -1;
    }
  }
  return set_local._4_4_;
}

Assistant:

static int
moveto_snode_parent(struct lyxp_set *set, struct lys_node *cur_node, int all_desc, int options)
{
    int idx, i, orig_used, temp_ctx = 0;
    struct lys_node *node, *new_node;
    const struct lys_node *root;
    enum lyxp_node_type root_type, new_type;

    if (!set || (set->type == LYXP_SET_EMPTY)) {
        return EXIT_SUCCESS;
    }

    if (set->type != LYXP_SET_SNODE_SET) {
        LOGVAL(LYE_XPATH_INOP_1, LY_VLOG_NONE, NULL, "path operator", print_set_type(set));
        return -1;
    }

    if (all_desc) {
        /* <path>//.. == <path>//./.. */
        idx = moveto_snode_self(set, cur_node, 1, options);
        if (idx) {
            return idx;
        }
    }

    root = moveto_snode_get_root(cur_node, options, &root_type);

    orig_used = set->used;
    for (i = 0; i < orig_used; ++i) {
        if (set->val.snodes[i].in_ctx != 1) {
            continue;
        }
        set->val.snodes[i].in_ctx = 0;

        node = set->val.snodes[i].snode;

        if (set->val.snodes[i].type == LYXP_NODE_ELEM) {
            for (new_node = lys_parent(node);
                 new_node && (new_node->nodetype & (LYS_USES | LYS_CHOICE | LYS_CASE | LYS_INPUT | LYS_OUTPUT));
                 new_node = lys_parent(new_node));
        } else {
            /* root does not have a parent */
            continue;
        }

        /* node already there can also be the root */
        if (root == node) {
            if ((options & (LYXP_SNODE_MUST | LYXP_SNODE_WHEN)) && (cur_node->flags & LYS_CONFIG_W)) {
                new_type = LYXP_NODE_ROOT_CONFIG;
            } else {
                new_type = LYXP_NODE_ROOT;
            }
            new_node = node;

        /* node has no parent */
        } else if (!new_node) {
            if ((options & (LYXP_SNODE_MUST | LYXP_SNODE_WHEN)) && (cur_node->flags & LYS_CONFIG_W)) {
                new_type = LYXP_NODE_ROOT_CONFIG;
            } else {
                new_type = LYXP_NODE_ROOT;
            }
#ifndef NDEBUG
            node = (struct lys_node *)lys_getnext(NULL, NULL, lys_node_module(node), 0);
            if (node != root) {
                LOGINT;
            }
#endif
            new_node = (struct lys_node *)root;

        /* node has a standard parent (it can equal the root, it's not the root yet since they are fake) */
        } else {
            new_type = LYXP_NODE_ELEM;
        }

        assert((new_type == LYXP_NODE_ELEM) || ((new_type == root_type) && (new_node == root)));

        idx = set_snode_insert_node(set, new_node, new_type);
        if ((idx < orig_used) && (idx > i)) {
            set->val.snodes[idx].in_ctx = 2;
            temp_ctx = 1;
        }
    }

    if (temp_ctx) {
        for (i = 0; i < orig_used; ++i) {
            if (set->val.snodes[i].in_ctx == 2) {
                set->val.snodes[i].in_ctx = 1;
            }
        }
    }

    return EXIT_SUCCESS;
}